

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O2

int createNode(lua_State *L)

{
  EmmyFacade *L_00;
  Arena<Variable> *this;
  Idx<Variable> IVar1;
  Idx<Variable> variable;
  undefined1 local_20 [16];
  
  L_00 = EmmyFacade::Get();
  EmmyFacade::GetDebugger((EmmyFacade *)local_20,(lua_State *)L_00);
  this = Debugger::GetVariableArena((Debugger *)local_20._0_8_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_20 + 8));
  if (this != (Arena<Variable> *)0x0) {
    IVar1 = Arena<Variable>::Alloc(this);
    variable._arena = IVar1._arena;
    variable._4_4_ = 0;
    variable.Raw = IVar1.Raw;
    pushVariable(L,variable);
  }
  return (uint)(this != (Arena<Variable> *)0x0);
}

Assistant:

int createNode(lua_State* L)
{
	auto arenaRef = EmmyFacade::Get().GetDebugger(L)->GetVariableArena();
	if (arenaRef)
	{
		auto idx = arenaRef->Alloc();
		pushVariable(L, idx);
		return 1;
	}
	else
	{
		return 0;
	}
}